

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O1

void DumpTables(Float *frequencies,Float *expFrequencies,int thetaRes,int phiRes,char *filename)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ostream *poVar4;
  long lVar5;
  ofstream f;
  ulong local_260;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,filename,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"frequencies = [ ",0x10);
  uVar2 = (ulong)(uint)phiRes;
  uVar3 = (ulong)(uint)thetaRes;
  if (0 < thetaRes) {
    local_260 = 0;
    do {
      if (0 < phiRes) {
        lVar5 = 1;
        do {
          std::ostream::_M_insert<double>((double)frequencies[lVar5 + -1]);
          if (lVar5 < phiRes) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,", ",2);
          }
          lVar1 = (1 - uVar2) + lVar5;
          lVar5 = lVar5 + 1;
        } while (lVar1 != 1);
      }
      local_260 = local_260 + 1;
      if (local_260 < uVar3) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"; ",2);
      }
      frequencies = frequencies + uVar2;
    } while (local_260 != uVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ];",3);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"expFrequencies = [ ",0x13);
  if (0 < thetaRes) {
    local_260 = 0;
    do {
      if (0 < phiRes) {
        lVar5 = 1;
        do {
          std::ostream::_M_insert<double>((double)expFrequencies[lVar5 + -1]);
          if (lVar5 < phiRes) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,", ",2);
          }
          lVar1 = (1 - uVar2) + lVar5;
          lVar5 = lVar5 + 1;
        } while (lVar1 != 1);
      }
      local_260 = local_260 + 1;
      if (local_260 < uVar3) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"; ",2);
      }
      expFrequencies = expFrequencies + uVar2;
    } while (local_260 != uVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ];",3);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"colormap(jet);",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"clf; subplot(2,1,1);",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"imagesc(frequencies);",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"title(\'Observed frequencies\');",0x1e)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"axis equal;",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"subplot(2,1,2);",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"imagesc(expFrequencies);",0x18);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"axis equal;",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"title(\'Expected frequencies\');",0x1e)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _throwErrnoExc;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void DumpTables(const Float* frequencies, const Float* expFrequencies, int thetaRes,
                int phiRes, const char* filename) {
    std::ofstream f(filename);

    f << "frequencies = [ ";
    for (int i = 0; i < thetaRes; ++i) {
        for (int j = 0; j < phiRes; ++j) {
            f << frequencies[i * phiRes + j];
            if (j + 1 < phiRes)
                f << ", ";
        }
        if (i + 1 < thetaRes)
            f << "; ";
    }
    f << " ];" << std::endl << "expFrequencies = [ ";
    for (int i = 0; i < thetaRes; ++i) {
        for (int j = 0; j < phiRes; ++j) {
            f << expFrequencies[i * phiRes + j];
            if (j + 1 < phiRes)
                f << ", ";
        }
        if (i + 1 < thetaRes)
            f << "; ";
    }
    f << " ];" << std::endl
      << "colormap(jet);" << std::endl
      << "clf; subplot(2,1,1);" << std::endl
      << "imagesc(frequencies);" << std::endl
      << "title('Observed frequencies');" << std::endl
      << "axis equal;" << std::endl
      << "subplot(2,1,2);" << std::endl
      << "imagesc(expFrequencies);" << std::endl
      << "axis equal;" << std::endl
      << "title('Expected frequencies');" << std::endl;
    f.close();
}